

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O3

int yajl_gen_config(yajl_gen g,yajl_gen_option opt,...)

{
  byte bVar1;
  int iVar2;
  void *in_RCX;
  yajl_print_t in_RDX;
  va_list ap;
  byte *local_a8;
  
  iVar2 = 0;
  switch(opt) {
  case yajl_gen_indent_string:
    g->indentString = (char *)local_a8;
    iVar2 = 1;
    do {
      bVar1 = *local_a8;
      if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
        if (bVar1 == 0) {
          return iVar2;
        }
        g->indentString = (char *)0x0;
        iVar2 = 0;
      }
      local_a8 = local_a8 + 1;
    } while( true );
  case yajl_gen_indent_string|yajl_gen_beautify:
  case yajl_gen_print_callback|yajl_gen_beautify:
  case yajl_gen_print_callback|yajl_gen_indent_string:
  case yajl_gen_print_callback|yajl_gen_indent_string|yajl_gen_beautify:
    goto switchD_00104df3_caseD_3;
  case yajl_gen_print_callback:
    yajl_buf_free((yajl_buf)g->ctx);
    g->print = in_RDX;
    g->ctx = in_RCX;
    break;
  default:
    if (opt != yajl_gen_escape_solidus) {
      return 0;
    }
  case yajl_gen_beautify:
  case yajl_gen_validate_utf8:
    if ((int)local_a8 == 0) {
      g->flags = g->flags & ~opt;
    }
    else {
      g->flags = g->flags | opt;
    }
  }
  iVar2 = 1;
switchD_00104df3_caseD_3:
  return iVar2;
}

Assistant:

int
yajl_gen_config(yajl_gen g, yajl_gen_option opt, ...)
{
    int rv = 1;
    va_list ap;
    va_start(ap, opt);

    switch(opt) {
        case yajl_gen_beautify:
        case yajl_gen_validate_utf8:
        case yajl_gen_escape_solidus:
            if (va_arg(ap, int)) g->flags |= opt;
            else g->flags &= ~opt;
            break;
        case yajl_gen_indent_string: {
            const char *indent = va_arg(ap, const char *);
            g->indentString = indent;
            for (; *indent; indent++) {
                if (*indent != '\n'
                    && *indent != '\v'
                    && *indent != '\f'
                    && *indent != '\t'
                    && *indent != '\r'
                    && *indent != ' ')
                {
                    g->indentString = NULL;
                    rv = 0;
                }
            }
            break;
        }
        case yajl_gen_print_callback:
            yajl_buf_free(g->ctx);
            g->print = va_arg(ap, const yajl_print_t);
            g->ctx = va_arg(ap, void *);
            break;
        default:
            rv = 0;
    }

    va_end(ap);

    return rv;
}